

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_device.cpp
# Opt level: O0

bool __thiscall booster::aio::basic_io_device::dont_block(basic_io_device *this,event_handler *h)

{
  error_code *in_RDI;
  basic_io_device *unaff_retaddr;
  error_code e;
  event_handler *in_stack_ffffffffffffffc8;
  basic_io_device *in_stack_ffffffffffffffe0;
  error_code *e_00;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if ((in_RDI[1].field_0x5 & 1) == 0) {
    e_00 = in_RDI;
    std::error_code::error_code(in_RDI);
    set_non_blocking(unaff_retaddr,(bool)in_stack_ffffffffffffffff,e_00);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffd8);
    if (bVar1) {
      get_io_service(in_stack_ffffffffffffffe0);
      io_service::post((io_service *)in_RDI,in_stack_ffffffffffffffc8,(error_code *)0x216ddf);
      bVar1 = false;
    }
    else {
      in_RDI[1].field_0x5 = 1;
      bVar1 = true;
    }
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool basic_io_device::dont_block(event_handler const &h)
{
	if(nonblocking_was_set_)
		return true;
	system::error_code e;
	set_non_blocking(true,e);
	if(e) {
		get_io_service().post(h,e);
		return false;
	}
	nonblocking_was_set_ = true;
	return true;
}